

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall ncnn::Gemm::load_model(Gemm *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  undefined4 *local_870;
  int *local_868;
  long *local_850;
  void *local_828;
  int *local_820;
  undefined8 local_818;
  undefined4 local_810;
  long *local_808;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined8 local_7e8;
  void *local_7e0;
  int *local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  long *local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined8 local_7a0;
  void *local_798;
  int *local_790;
  undefined8 local_788;
  undefined4 local_780;
  long *local_778;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined8 local_758;
  void *local_750;
  int *local_748;
  undefined8 local_740;
  undefined4 local_738;
  long *local_730;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined8 local_710;
  void *local_708;
  int *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long *local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  void *local_6c0;
  int *local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  void *local_678;
  int *local_670;
  undefined8 local_668;
  undefined4 local_660;
  long *local_658;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined8 local_638;
  void *local_630;
  int *local_628;
  undefined8 local_620;
  undefined4 local_618;
  long *local_610;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined8 local_5f0;
  void *local_5e8;
  int *local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  long *local_5c8;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined8 local_5a8;
  void *local_590;
  int *local_588;
  undefined8 local_580;
  undefined4 local_578;
  long *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined8 local_550;
  long *local_548;
  void **local_530;
  void **local_520;
  void **local_510;
  void **local_500;
  void **local_4f0;
  void **local_4e0;
  void **local_4d0;
  void **local_4c0;
  void **local_4b0;
  void **local_4a0;
  undefined4 **local_490;
  int local_480;
  undefined4 local_47c;
  void **local_478;
  void **local_470;
  void **local_468;
  int local_460;
  undefined4 local_45c;
  void **local_458;
  void **local_450;
  void **local_448;
  int local_440;
  undefined4 local_43c;
  void **local_438;
  void **local_430;
  void **local_428;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  void **local_410;
  void **local_408;
  int local_400;
  undefined4 local_3fc;
  void **local_3f8;
  void **local_3f0;
  void **local_3e8;
  int local_3e0;
  undefined4 local_3dc;
  void **local_3d8;
  void **local_3d0;
  void **local_3c8;
  int local_3c0;
  undefined4 local_3bc;
  void **local_3b8;
  void **local_3b0;
  void **local_3a8;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  void **local_390;
  void **local_388;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  void **local_370;
  void **local_368;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  void **local_350;
  void **local_348;
  long *local_340;
  long *local_338;
  long *local_330;
  undefined8 local_328;
  undefined4 **local_320;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  int local_2c8;
  undefined4 local_2c4;
  void **local_2c0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_298;
  undefined4 local_294;
  void **local_290;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  undefined4 **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_208;
  undefined4 local_204;
  void **local_200;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_148;
  undefined4 local_144;
  void **local_140;
  int local_128;
  undefined4 local_124;
  void **local_120;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_548 = in_RSI;
  if (*(int *)(in_RDI + 0xe0) == 1) {
    if (*(int *)(in_RDI + 0xd8) == 0) {
      (**(code **)(*in_RSI + 0x18))
                (&local_590,in_RSI,*(undefined4 *)(in_RDI + 0xf4),*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x120);
      local_358 = &local_590;
      local_350 = ppvVar2;
      if (ppvVar2 != local_358) {
        if (local_588 != (int *)0x0) {
          local_35c = 1;
          LOCK();
          local_360 = *local_588;
          *local_588 = *local_588 + 1;
          UNLOCK();
        }
        local_310 = ppvVar2;
        if (*(long *)(in_RDI + 0x128) != 0) {
          piVar1 = *(int **)(in_RDI + 0x128);
          local_314 = 0xffffffff;
          LOCK();
          local_318 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_318 == 1) {
            if (*(long *)(in_RDI + 0x140) == 0) {
              local_20 = *ppvVar2;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x140) + 0x18))(*(long **)(in_RDI + 0x140),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x130) = 0;
        *(undefined4 *)(in_RDI + 0x138) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x14c) = 0;
        *(undefined4 *)(in_RDI + 0x150) = 0;
        *(undefined4 *)(in_RDI + 0x154) = 0;
        *(undefined4 *)(in_RDI + 0x158) = 0;
        *(undefined8 *)(in_RDI + 0x160) = 0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *ppvVar2 = *local_358;
        *(void **)(in_RDI + 0x128) = local_358[1];
        *(void **)(in_RDI + 0x130) = local_358[2];
        *(undefined4 *)(in_RDI + 0x138) = *(undefined4 *)(local_358 + 3);
        *(void **)(in_RDI + 0x140) = local_358[4];
        *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_358 + 5);
        *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)((long)local_358 + 0x2c);
        *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_358 + 6);
        *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_358 + 0x34);
        *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_358 + 7);
        *(void **)(in_RDI + 0x160) = local_358[8];
      }
      local_530 = &local_590;
      local_348 = ppvVar2;
      local_120 = local_530;
      if (local_588 != (int *)0x0) {
        local_124 = 0xffffffff;
        LOCK();
        local_128 = *local_588;
        *local_588 = *local_588 + -1;
        UNLOCK();
        if (local_128 == 1) {
          if (local_570 == (long *)0x0) {
            if (local_590 != (void *)0x0) {
              free(local_590);
            }
          }
          else {
            (**(code **)(*local_570 + 0x18))(local_570,local_590);
          }
        }
      }
      local_590 = (void *)0x0;
      local_580 = 0;
      local_578 = 0;
      local_568 = 0;
      local_564 = 0;
      local_560 = 0;
      local_55c = 0;
      local_558 = 0;
      local_550 = 0;
      local_588 = (int *)0x0;
    }
    else {
      (**(code **)(*in_RSI + 0x18))
                (&local_5e8,in_RSI,*(undefined4 *)(in_RDI + 0xec),*(undefined4 *)(in_RDI + 0xf4),0);
      ppvVar2 = (void **)(in_RDI + 0x120);
      local_378 = &local_5e8;
      local_370 = ppvVar2;
      if (ppvVar2 != local_378) {
        if (local_5e0 != (int *)0x0) {
          local_37c = 1;
          LOCK();
          local_380 = *local_5e0;
          *local_5e0 = *local_5e0 + 1;
          UNLOCK();
        }
        local_300 = ppvVar2;
        if (*(long *)(in_RDI + 0x128) != 0) {
          piVar1 = *(int **)(in_RDI + 0x128);
          local_304 = 0xffffffff;
          LOCK();
          local_308 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_308 == 1) {
            if (*(long *)(in_RDI + 0x140) == 0) {
              local_28 = *ppvVar2;
              if (local_28 != (void *)0x0) {
                free(local_28);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x140) + 0x18))(*(long **)(in_RDI + 0x140),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x130) = 0;
        *(undefined4 *)(in_RDI + 0x138) = 0;
        *(undefined4 *)(in_RDI + 0x148) = 0;
        *(undefined4 *)(in_RDI + 0x14c) = 0;
        *(undefined4 *)(in_RDI + 0x150) = 0;
        *(undefined4 *)(in_RDI + 0x154) = 0;
        *(undefined4 *)(in_RDI + 0x158) = 0;
        *(undefined8 *)(in_RDI + 0x160) = 0;
        *(undefined8 *)(in_RDI + 0x128) = 0;
        *ppvVar2 = *local_378;
        *(void **)(in_RDI + 0x128) = local_378[1];
        *(void **)(in_RDI + 0x130) = local_378[2];
        *(undefined4 *)(in_RDI + 0x138) = *(undefined4 *)(local_378 + 3);
        *(void **)(in_RDI + 0x140) = local_378[4];
        *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_378 + 5);
        *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)((long)local_378 + 0x2c);
        *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_378 + 6);
        *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_378 + 0x34);
        *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_378 + 7);
        *(void **)(in_RDI + 0x160) = local_378[8];
      }
      local_520 = &local_5e8;
      local_368 = ppvVar2;
      local_140 = local_520;
      if (local_5e0 != (int *)0x0) {
        local_144 = 0xffffffff;
        LOCK();
        local_148 = *local_5e0;
        *local_5e0 = *local_5e0 + -1;
        UNLOCK();
        if (local_148 == 1) {
          if (local_5c8 == (long *)0x0) {
            if (local_5e8 != (void *)0x0) {
              free(local_5e8);
            }
          }
          else {
            (**(code **)(*local_5c8 + 0x18))(local_5c8,local_5e8);
          }
        }
      }
      local_5e8 = (void *)0x0;
      local_5d8 = 0;
      local_5d0 = 0;
      local_5c0 = 0;
      local_5bc = 0;
      local_5b8 = 0;
      local_5b4 = 0;
      local_5b0 = 0;
      local_5a8 = 0;
      local_5e0 = (int *)0x0;
    }
    local_330 = (long *)(in_RDI + 0x120);
    bVar3 = true;
    if (*local_330 != 0) {
      bVar3 = *(long *)(in_RDI + 0x160) * (long)*(int *)(in_RDI + 0x158) == 0;
      local_18 = local_330;
    }
    if (bVar3) {
      return -100;
    }
  }
  if (*(int *)(in_RDI + 0xe4) == 1) {
    if (*(int *)(in_RDI + 0xdc) == 0) {
      (**(code **)(*local_548 + 0x18))
                (&local_630,local_548,*(undefined4 *)(in_RDI + 0xf0),*(undefined4 *)(in_RDI + 0xf4),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x168);
      local_398 = &local_630;
      local_390 = ppvVar2;
      if (ppvVar2 != local_398) {
        if (local_628 != (int *)0x0) {
          local_39c = 1;
          LOCK();
          local_3a0 = *local_628;
          *local_628 = *local_628 + 1;
          UNLOCK();
        }
        local_2f0 = ppvVar2;
        if (*(long *)(in_RDI + 0x170) != 0) {
          piVar1 = *(int **)(in_RDI + 0x170);
          local_2f4 = 0xffffffff;
          LOCK();
          local_2f8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2f8 == 1) {
            if (*(long *)(in_RDI + 0x188) == 0) {
              local_30 = *ppvVar2;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
        *(undefined4 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x194) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined8 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *ppvVar2 = *local_398;
        *(void **)(in_RDI + 0x170) = local_398[1];
        *(void **)(in_RDI + 0x178) = local_398[2];
        *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_398 + 3);
        *(void **)(in_RDI + 0x188) = local_398[4];
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_398 + 5);
        *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_398 + 0x2c);
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_398 + 6);
        *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_398 + 0x34);
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_398 + 7);
        *(void **)(in_RDI + 0x1a8) = local_398[8];
      }
      local_510 = &local_630;
      local_388 = ppvVar2;
      local_160 = local_510;
      if (local_628 != (int *)0x0) {
        local_164 = 0xffffffff;
        LOCK();
        local_168 = *local_628;
        *local_628 = *local_628 + -1;
        UNLOCK();
        if (local_168 == 1) {
          if (local_610 == (long *)0x0) {
            if (local_630 != (void *)0x0) {
              free(local_630);
            }
          }
          else {
            (**(code **)(*local_610 + 0x18))(local_610,local_630);
          }
        }
      }
      local_630 = (void *)0x0;
      local_620 = 0;
      local_618 = 0;
      local_608 = 0;
      local_604 = 0;
      local_600 = 0;
      local_5fc = 0;
      local_5f8 = 0;
      local_5f0 = 0;
      local_628 = (int *)0x0;
    }
    else {
      (**(code **)(*local_548 + 0x18))
                (&local_678,local_548,*(undefined4 *)(in_RDI + 0xf4),*(undefined4 *)(in_RDI + 0xf0),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x168);
      local_3b8 = &local_678;
      local_3b0 = ppvVar2;
      if (ppvVar2 != local_3b8) {
        if (local_670 != (int *)0x0) {
          local_3bc = 1;
          LOCK();
          local_3c0 = *local_670;
          *local_670 = *local_670 + 1;
          UNLOCK();
        }
        local_2e0 = ppvVar2;
        if (*(long *)(in_RDI + 0x170) != 0) {
          piVar1 = *(int **)(in_RDI + 0x170);
          local_2e4 = 0xffffffff;
          LOCK();
          local_2e8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2e8 == 1) {
            if (*(long *)(in_RDI + 0x188) == 0) {
              local_38 = *ppvVar2;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
        *(undefined4 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x194) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined8 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x170) = 0;
        *ppvVar2 = *local_3b8;
        *(void **)(in_RDI + 0x170) = local_3b8[1];
        *(void **)(in_RDI + 0x178) = local_3b8[2];
        *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_3b8 + 3);
        *(void **)(in_RDI + 0x188) = local_3b8[4];
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_3b8 + 5);
        *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_3b8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_3b8 + 6);
        *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_3b8 + 0x34);
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_3b8 + 7);
        *(void **)(in_RDI + 0x1a8) = local_3b8[8];
      }
      local_500 = &local_678;
      local_3a8 = ppvVar2;
      local_180 = local_500;
      if (local_670 != (int *)0x0) {
        local_184 = 0xffffffff;
        LOCK();
        local_188 = *local_670;
        *local_670 = *local_670 + -1;
        UNLOCK();
        if (local_188 == 1) {
          if (local_658 == (long *)0x0) {
            if (local_678 != (void *)0x0) {
              free(local_678);
            }
          }
          else {
            (**(code **)(*local_658 + 0x18))(local_658,local_678);
          }
        }
      }
      local_678 = (void *)0x0;
      local_668 = 0;
      local_660 = 0;
      local_650 = 0;
      local_64c = 0;
      local_648 = 0;
      local_644 = 0;
      local_640 = 0;
      local_638 = 0;
      local_670 = (int *)0x0;
    }
    local_338 = (long *)(in_RDI + 0x168);
    bVar3 = true;
    if (*local_338 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1a8) * (long)*(int *)(in_RDI + 0x1a0) == 0;
      local_10 = local_338;
    }
    if (bVar3) {
      return -100;
    }
  }
  if ((*(int *)(in_RDI + 0xe8) == 1) && (*(int *)(in_RDI + 0xf8) != -1)) {
    if (*(int *)(in_RDI + 0xf8) == 0) {
      (**(code **)(*local_548 + 0x10))(&local_6c0,local_548,1,0);
      ppvVar2 = (void **)(in_RDI + 0x1b0);
      local_3d8 = &local_6c0;
      local_3d0 = ppvVar2;
      if (ppvVar2 != local_3d8) {
        if (local_6b8 != (int *)0x0) {
          local_3dc = 1;
          LOCK();
          local_3e0 = *local_6b8;
          *local_6b8 = *local_6b8 + 1;
          UNLOCK();
        }
        local_2d0 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_2d4 = 0xffffffff;
          LOCK();
          local_2d8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2d8 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              local_40 = *ppvVar2;
              if (local_40 != (void *)0x0) {
                free(local_40);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1f0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *ppvVar2 = *local_3d8;
        *(void **)(in_RDI + 0x1b8) = local_3d8[1];
        *(void **)(in_RDI + 0x1c0) = local_3d8[2];
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_3d8 + 3);
        *(void **)(in_RDI + 0x1d0) = local_3d8[4];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_3d8 + 5);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_3d8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_3d8 + 6);
        *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_3d8 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_3d8 + 7);
        *(void **)(in_RDI + 0x1f0) = local_3d8[8];
      }
      local_4f0 = &local_6c0;
      local_3c8 = ppvVar2;
      local_1a0 = local_4f0;
      if (local_6b8 != (int *)0x0) {
        local_1a4 = 0xffffffff;
        LOCK();
        local_1a8 = *local_6b8;
        *local_6b8 = *local_6b8 + -1;
        UNLOCK();
        if (local_1a8 == 1) {
          if (local_6a0 == (long *)0x0) {
            if (local_6c0 != (void *)0x0) {
              free(local_6c0);
            }
          }
          else {
            (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
          }
        }
      }
      local_6c0 = (void *)0x0;
      local_6b0 = 0;
      local_6a8 = 0;
      local_698 = 0;
      local_694 = 0;
      local_690 = 0;
      local_68c = 0;
      local_688 = 0;
      local_680 = 0;
      local_6b8 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 1) {
      (**(code **)(*local_548 + 0x10))(&local_708,local_548,*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x1b0);
      local_3f8 = &local_708;
      local_3f0 = ppvVar2;
      if (ppvVar2 != local_3f8) {
        if (local_700 != (int *)0x0) {
          local_3fc = 1;
          LOCK();
          local_400 = *local_700;
          *local_700 = *local_700 + 1;
          UNLOCK();
        }
        local_2c0 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_2c4 = 0xffffffff;
          LOCK();
          local_2c8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2c8 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              local_48 = *ppvVar2;
              if (local_48 != (void *)0x0) {
                free(local_48);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1f0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *ppvVar2 = *local_3f8;
        *(void **)(in_RDI + 0x1b8) = local_3f8[1];
        *(void **)(in_RDI + 0x1c0) = local_3f8[2];
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_3f8 + 3);
        *(void **)(in_RDI + 0x1d0) = local_3f8[4];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_3f8 + 5);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_3f8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_3f8 + 6);
        *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_3f8 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_3f8 + 7);
        *(void **)(in_RDI + 0x1f0) = local_3f8[8];
      }
      local_4e0 = &local_708;
      local_3e8 = ppvVar2;
      local_1c0 = local_4e0;
      if (local_700 != (int *)0x0) {
        local_1c4 = 0xffffffff;
        LOCK();
        local_1c8 = *local_700;
        *local_700 = *local_700 + -1;
        UNLOCK();
        if (local_1c8 == 1) {
          if (local_6e8 == (long *)0x0) {
            if (local_708 != (void *)0x0) {
              free(local_708);
            }
          }
          else {
            (**(code **)(*local_6e8 + 0x18))(local_6e8,local_708);
          }
        }
      }
      local_708 = (void *)0x0;
      local_6f8 = 0;
      local_6f0 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6c8 = 0;
      local_700 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 2) {
      (**(code **)(*local_548 + 0x18))(&local_750,local_548,1,*(undefined4 *)(in_RDI + 0xec),0);
      ppvVar2 = (void **)(in_RDI + 0x1b0);
      local_418 = &local_750;
      local_410 = ppvVar2;
      if (ppvVar2 != local_418) {
        if (local_748 != (int *)0x0) {
          local_41c = 1;
          LOCK();
          local_420 = *local_748;
          *local_748 = *local_748 + 1;
          UNLOCK();
        }
        local_2b0 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_2b4 = 0xffffffff;
          LOCK();
          local_2b8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2b8 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              local_50 = *ppvVar2;
              if (local_50 != (void *)0x0) {
                free(local_50);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1f0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *ppvVar2 = *local_418;
        *(void **)(in_RDI + 0x1b8) = local_418[1];
        *(void **)(in_RDI + 0x1c0) = local_418[2];
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_418 + 3);
        *(void **)(in_RDI + 0x1d0) = local_418[4];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_418 + 5);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_418 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_418 + 6);
        *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_418 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_418 + 7);
        *(void **)(in_RDI + 0x1f0) = local_418[8];
      }
      local_4d0 = &local_750;
      local_408 = ppvVar2;
      local_1e0 = local_4d0;
      if (local_748 != (int *)0x0) {
        local_1e4 = 0xffffffff;
        LOCK();
        local_1e8 = *local_748;
        *local_748 = *local_748 + -1;
        UNLOCK();
        if (local_1e8 == 1) {
          if (local_730 == (long *)0x0) {
            if (local_750 != (void *)0x0) {
              free(local_750);
            }
          }
          else {
            (**(code **)(*local_730 + 0x18))(local_730,local_750);
          }
        }
      }
      local_750 = (void *)0x0;
      local_740 = 0;
      local_738 = 0;
      local_728 = 0;
      local_724 = 0;
      local_720 = 0;
      local_71c = 0;
      local_718 = 0;
      local_710 = 0;
      local_748 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 3) {
      (**(code **)(*local_548 + 0x18))
                (&local_798,local_548,*(undefined4 *)(in_RDI + 0xf0),*(undefined4 *)(in_RDI + 0xec),
                 0);
      ppvVar2 = (void **)(in_RDI + 0x1b0);
      local_438 = &local_798;
      local_430 = ppvVar2;
      if (ppvVar2 != local_438) {
        if (local_790 != (int *)0x0) {
          local_43c = 1;
          LOCK();
          local_440 = *local_790;
          *local_790 = *local_790 + 1;
          UNLOCK();
        }
        local_2a0 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              local_58 = *ppvVar2;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1f0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *ppvVar2 = *local_438;
        *(void **)(in_RDI + 0x1b8) = local_438[1];
        *(void **)(in_RDI + 0x1c0) = local_438[2];
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_438 + 3);
        *(void **)(in_RDI + 0x1d0) = local_438[4];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_438 + 5);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_438 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_438 + 6);
        *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_438 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_438 + 7);
        *(void **)(in_RDI + 0x1f0) = local_438[8];
      }
      local_4c0 = &local_798;
      local_428 = ppvVar2;
      local_200 = local_4c0;
      if (local_790 != (int *)0x0) {
        local_204 = 0xffffffff;
        LOCK();
        local_208 = *local_790;
        *local_790 = *local_790 + -1;
        UNLOCK();
        if (local_208 == 1) {
          if (local_778 == (long *)0x0) {
            if (local_798 != (void *)0x0) {
              free(local_798);
            }
          }
          else {
            (**(code **)(*local_778 + 0x18))(local_778,local_798);
          }
        }
      }
      local_798 = (void *)0x0;
      local_788 = 0;
      local_780 = 0;
      local_770 = 0;
      local_76c = 0;
      local_768 = 0;
      local_764 = 0;
      local_760 = 0;
      local_758 = 0;
      local_790 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xf8) == 4) {
      (**(code **)(*local_548 + 0x18))(&local_7e0,local_548,*(undefined4 *)(in_RDI + 0xf0),1,0);
      ppvVar2 = (void **)(in_RDI + 0x1b0);
      local_458 = &local_7e0;
      local_450 = ppvVar2;
      if (ppvVar2 != local_458) {
        if (local_7d8 != (int *)0x0) {
          local_45c = 1;
          LOCK();
          local_460 = *local_7d8;
          *local_7d8 = *local_7d8 + 1;
          UNLOCK();
        }
        local_290 = ppvVar2;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1b8);
          local_294 = 0xffffffff;
          LOCK();
          local_298 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_298 == 1) {
            if (*(long *)(in_RDI + 0x1d0) == 0) {
              local_60 = *ppvVar2;
              if (local_60 != (void *)0x0) {
                free(local_60);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1dc) = 0;
        *(undefined4 *)(in_RDI + 0x1e0) = 0;
        *(undefined4 *)(in_RDI + 0x1e4) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined8 *)(in_RDI + 0x1f0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *ppvVar2 = *local_458;
        *(void **)(in_RDI + 0x1b8) = local_458[1];
        *(void **)(in_RDI + 0x1c0) = local_458[2];
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_458 + 3);
        *(void **)(in_RDI + 0x1d0) = local_458[4];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_458 + 5);
        *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_458 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_458 + 6);
        *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_458 + 0x34);
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_458 + 7);
        *(void **)(in_RDI + 0x1f0) = local_458[8];
      }
      local_4b0 = &local_7e0;
      local_448 = ppvVar2;
      local_220 = local_4b0;
      if (local_7d8 != (int *)0x0) {
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *local_7d8;
        *local_7d8 = *local_7d8 + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (local_7c0 == (long *)0x0) {
            if (local_7e0 != (void *)0x0) {
              free(local_7e0);
            }
          }
          else {
            (**(code **)(*local_7c0 + 0x18))(local_7c0,local_7e0);
          }
        }
      }
      local_7e0 = (void *)0x0;
      local_7d0 = 0;
      local_7c8 = 0;
      local_7b8 = 0;
      local_7b4 = 0;
      local_7b0 = 0;
      local_7ac = 0;
      local_7a8 = 0;
      local_7a0 = 0;
      local_7d8 = (int *)0x0;
    }
    local_340 = (long *)(in_RDI + 0x1b0);
    bVar3 = true;
    if (*local_340 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1f0) * (long)*(int *)(in_RDI + 0x1e8) == 0;
      local_8 = local_340;
    }
    if (bVar3) {
      return -100;
    }
  }
  if (*(int *)(in_RDI + 0x10c) != 0) {
    if (*(int *)(in_RDI + 0xe0) == 1) {
      (**(code **)(*local_548 + 0x10))(&local_828,local_548,*(undefined4 *)(in_RDI + 0xec),1);
      ppvVar2 = (void **)(in_RDI + 0x1f8);
      local_478 = &local_828;
      local_470 = ppvVar2;
      if (ppvVar2 != local_478) {
        if (local_820 != (int *)0x0) {
          local_47c = 1;
          LOCK();
          local_480 = *local_820;
          *local_820 = *local_820 + 1;
          UNLOCK();
        }
        local_280 = ppvVar2;
        if (*(long *)(in_RDI + 0x200) != 0) {
          piVar1 = *(int **)(in_RDI + 0x200);
          local_284 = 0xffffffff;
          LOCK();
          local_288 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_288 == 1) {
            if (*(long *)(in_RDI + 0x218) == 0) {
              local_68 = *ppvVar2;
              if (local_68 != (void *)0x0) {
                free(local_68);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x218) + 0x18))(*(long **)(in_RDI + 0x218),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x208) = 0;
        *(undefined4 *)(in_RDI + 0x210) = 0;
        *(undefined4 *)(in_RDI + 0x220) = 0;
        *(undefined4 *)(in_RDI + 0x224) = 0;
        *(undefined4 *)(in_RDI + 0x228) = 0;
        *(undefined4 *)(in_RDI + 0x22c) = 0;
        *(undefined4 *)(in_RDI + 0x230) = 0;
        *(undefined8 *)(in_RDI + 0x238) = 0;
        *(undefined8 *)(in_RDI + 0x200) = 0;
        *ppvVar2 = *local_478;
        *(void **)(in_RDI + 0x200) = local_478[1];
        *(void **)(in_RDI + 0x208) = local_478[2];
        *(undefined4 *)(in_RDI + 0x210) = *(undefined4 *)(local_478 + 3);
        *(void **)(in_RDI + 0x218) = local_478[4];
        *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_478 + 5);
        *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_478 + 0x2c);
        *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_478 + 6);
        *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_478 + 0x34);
        *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_478 + 7);
        *(void **)(in_RDI + 0x238) = local_478[8];
      }
      local_4a0 = &local_828;
      local_468 = ppvVar2;
      local_240 = local_4a0;
      if (local_820 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *local_820;
        *local_820 = *local_820 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (local_808 == (long *)0x0) {
            if (local_828 != (void *)0x0) {
              free(local_828);
            }
          }
          else {
            (**(code **)(*local_808 + 0x18))(local_808,local_828);
          }
        }
      }
      local_828 = (void *)0x0;
      local_818 = 0;
      local_810 = 0;
      local_800 = 0;
      local_7fc = 0;
      local_7f8 = 0;
      local_7f4 = 0;
      local_7f0 = 0;
      local_7e8 = 0;
      local_820 = (int *)0x0;
    }
    if (*(int *)(in_RDI + 0xe4) == 1) {
      (**(code **)(*local_548 + 0x10))(&local_870,local_548,1);
      local_320 = &local_870;
      local_328 = 0;
      *(undefined4 *)(in_RDI + 0x240) = *local_870;
      local_490 = &local_870;
      if (local_868 != (int *)0x0) {
        local_264 = 0xffffffff;
        LOCK();
        local_268 = *local_868;
        *local_868 = *local_868 + -1;
        UNLOCK();
        if (local_268 == 1) {
          local_260 = local_490;
          if (local_850 == (long *)0x0) {
            if (local_870 != (undefined4 *)0x0) {
              free(local_870);
            }
          }
          else {
            (**(code **)(*local_850 + 0x18))(local_850,local_870);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Gemm::load_model(const ModelBin& mb)
{
    if (constantA == 1)
    {
        if (transA == 0)
            A_data = mb.load(constantK, constantM, 0);
        else
            A_data = mb.load(constantM, constantK, 0);
        if (A_data.empty())
            return -100;
    }

    if (constantB == 1)
    {
        if (transB == 0)
            B_data = mb.load(constantN, constantK, 0);
        else
            B_data = mb.load(constantK, constantN, 0);
        if (B_data.empty())
            return -100;
    }

    if (constantC == 1 && constant_broadcast_type_C != -1)
    {
        if (constant_broadcast_type_C == 0)
            C_data = mb.load(1, 0);
        if (constant_broadcast_type_C == 1)
            C_data = mb.load(constantM, 0);
        if (constant_broadcast_type_C == 2)
            C_data = mb.load(1, constantM, 0);
        if (constant_broadcast_type_C == 3)
            C_data = mb.load(constantN, constantM, 0);
        if (constant_broadcast_type_C == 4)
            C_data = mb.load(constantN, 1, 0);
        if (C_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        if (constantA == 1)
        {
            A_data_int8_scales = mb.load(constantM, 1);
        }

        if (constantB == 1)
        {
            B_data_int8_scale = mb.load(1, 1)[0];
        }
    }
#endif // NCNN_INT8

    return 0;
}